

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.cpp
# Opt level: O0

uint __thiscall llvm::StringMapImpl::RehashTable(StringMapImpl *this,uint BucketNo)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  StringMapEntryBase **ppSVar4;
  StringMapEntryBase *pSVar5;
  long lVar6;
  StringMapEntryBase **ppSVar7;
  StringMapEntryBase *pSVar8;
  int local_5c;
  uint local_58;
  uint ProbeSize;
  uint NewBucket;
  uint FullHash;
  StringMapEntryBase *Bucket;
  uint E;
  uint I;
  uint *NewHashArray;
  StringMapEntryBase **NewTableArray;
  uint NewBucketNo;
  uint *HashTable;
  uint NewSize;
  uint BucketNo_local;
  StringMapImpl *this_local;
  
  ppSVar4 = this->TheTable;
  uVar1 = this->NumBuckets;
  if (this->NumBuckets * 3 < this->NumItems << 2) {
    HashTable._0_4_ = this->NumBuckets << 1;
  }
  else {
    if (this->NumBuckets >> 3 < this->NumBuckets - (this->NumItems + this->NumTombstones)) {
      return BucketNo;
    }
    HashTable._0_4_ = this->NumBuckets;
  }
  ppSVar7 = (StringMapEntryBase **)safe_calloc((ulong)((uint)HashTable + 1),0xc);
  lVar6 = (ulong)(uint)HashTable * 8 + 8;
  ppSVar7[(uint)HashTable] = (StringMapEntryBase *)0x2;
  Bucket._4_4_ = 0;
  uVar2 = this->NumBuckets;
  NewTableArray._4_4_ = BucketNo;
  for (; Bucket._4_4_ != uVar2; Bucket._4_4_ = Bucket._4_4_ + 1) {
    pSVar5 = this->TheTable[Bucket._4_4_];
    if ((pSVar5 != (StringMapEntryBase *)0x0) && (pSVar8 = getTombstoneVal(), pSVar5 != pSVar8)) {
      uVar3 = *(uint *)((long)ppSVar4 + (ulong)Bucket._4_4_ * 4 + (ulong)uVar1 * 8 + 8);
      local_58 = uVar3 & (uint)HashTable - 1;
      if (ppSVar7[local_58] == (StringMapEntryBase *)0x0) {
        ppSVar7[uVar3 & (uint)HashTable - 1] = pSVar5;
        *(uint *)((long)ppSVar7 + (ulong)(uVar3 & (uint)HashTable - 1) * 4 + lVar6) = uVar3;
        if (Bucket._4_4_ == BucketNo) {
          NewTableArray._4_4_ = local_58;
        }
      }
      else {
        local_5c = 1;
        do {
          local_58 = local_58 + local_5c & (uint)HashTable - 1;
          local_5c = local_5c + 1;
        } while (ppSVar7[local_58] != (StringMapEntryBase *)0x0);
        ppSVar7[local_58] = pSVar5;
        *(uint *)((long)ppSVar7 + (ulong)local_58 * 4 + lVar6) = uVar3;
        if (Bucket._4_4_ == BucketNo) {
          NewTableArray._4_4_ = local_58;
        }
      }
    }
  }
  free(this->TheTable);
  this->TheTable = ppSVar7;
  this->NumBuckets = (uint)HashTable;
  this->NumTombstones = 0;
  return NewTableArray._4_4_;
}

Assistant:

unsigned StringMapImpl::RehashTable(unsigned BucketNo) {
  unsigned NewSize;
  unsigned *HashTable = (unsigned *)(TheTable + NumBuckets + 1);

  // If the hash table is now more than 3/4 full, or if fewer than 1/8 of
  // the buckets are empty (meaning that many are filled with tombstones),
  // grow/rehash the table.
  if (LLVM_UNLIKELY(NumItems * 4 > NumBuckets * 3)) {
    NewSize = NumBuckets*2;
  } else if (LLVM_UNLIKELY(NumBuckets - (NumItems + NumTombstones) <=
                           NumBuckets / 8)) {
    NewSize = NumBuckets;
  } else {
    return BucketNo;
  }

  unsigned NewBucketNo = BucketNo;
  // Allocate one extra bucket which will always be non-empty.  This allows the
  // iterators to stop at end.
  auto NewTableArray = static_cast<StringMapEntryBase **>(
      safe_calloc(NewSize+1, sizeof(StringMapEntryBase *) + sizeof(unsigned)));

  unsigned *NewHashArray = (unsigned *)(NewTableArray + NewSize + 1);
  NewTableArray[NewSize] = (StringMapEntryBase*)2;

  // Rehash all the items into their new buckets.  Luckily :) we already have
  // the hash values available, so we don't have to rehash any strings.
  for (unsigned I = 0, E = NumBuckets; I != E; ++I) {
    StringMapEntryBase *Bucket = TheTable[I];
    if (Bucket && Bucket != getTombstoneVal()) {
      // Fast case, bucket available.
      unsigned FullHash = HashTable[I];
      unsigned NewBucket = FullHash & (NewSize-1);
      if (!NewTableArray[NewBucket]) {
        NewTableArray[FullHash & (NewSize-1)] = Bucket;
        NewHashArray[FullHash & (NewSize-1)] = FullHash;
        if (I == BucketNo)
          NewBucketNo = NewBucket;
        continue;
      }

      // Otherwise probe for a spot.
      unsigned ProbeSize = 1;
      do {
        NewBucket = (NewBucket + ProbeSize++) & (NewSize-1);
      } while (NewTableArray[NewBucket]);

      // Finally found a slot.  Fill it in.
      NewTableArray[NewBucket] = Bucket;
      NewHashArray[NewBucket] = FullHash;
      if (I == BucketNo)
        NewBucketNo = NewBucket;
    }
  }

  free(TheTable);

  TheTable = NewTableArray;
  NumBuckets = NewSize;
  NumTombstones = 0;
  return NewBucketNo;
}